

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::drawPrimitives
          (BaseRenderingTestInstance *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
          VkPrimitiveTopology primitiveTopology)

{
  size_type __n;
  allocator<tcu::Vector<float,_4>_> local_51;
  Vector<float,_4> local_50;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorData;
  VkPrimitiveTopology primitiveTopology_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData_local;
  Surface *result_local;
  BaseRenderingTestInstance *this_local;
  
  colorData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = primitiveTopology;
  __n = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                  (vertexData);
  tcu::Vector<float,_4>::Vector(&local_50,1.0,1.0,1.0,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_51);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,__n,
             &local_50,&local_51);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_51);
  drawPrimitives(this,result,vertexData,
                 (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,
                 colorData.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return;
}

Assistant:

void BaseRenderingTestInstance::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& vertexData, VkPrimitiveTopology primitiveTopology)
{
	// default to color white
	const std::vector<tcu::Vec4> colorData(vertexData.size(), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	drawPrimitives(result, vertexData, colorData, primitiveTopology);
}